

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O1

void predict_or_learn<true,true>(cbify *data,single_learner *base,example *ec)

{
  wclass *pwVar1;
  wclass *pwVar2;
  size_t sVar3;
  wclass *pwVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  float fVar11;
  float fVar12;
  label_t lVar13;
  cb_class *pcVar14;
  action_score *paVar15;
  action_score *paVar16;
  int iVar17;
  uint32_t uVar18;
  vw_exception *pvVar19;
  wclass *pwVar20;
  wclass *__end1;
  float fVar21;
  uint32_t chosen_action;
  cb_class cl;
  stringstream __msg;
  uint local_23c;
  polylabel *local_238;
  wclass **local_230;
  polyprediction *local_228;
  wclass *local_220;
  undefined8 local_218;
  float local_210;
  float fStack_20c;
  wclass *local_208;
  size_t sStack_200;
  string local_1f8;
  string local_1d8;
  pointer_____offset_0x10___ *local_1b8;
  float *local_1b0;
  ostream local_1a8;
  
  pwVar1 = (ec->l).cs.costs._begin;
  pwVar2 = (ec->l).cs.costs._end;
  local_208 = (ec->l).cs.costs.end_array;
  sStack_200 = (ec->l).cs.costs.erase_count;
  v_array<CB::cb_class>::clear((v_array<CB::cb_class> *)data);
  lVar13 = (label_t)(data->cb_label).costs._begin;
  pcVar14 = (data->cb_label).costs._end;
  sVar3 = (data->cb_label).costs.erase_count;
  (ec->l).cs.costs.end_array = (wclass *)(data->cb_label).costs.end_array;
  (ec->l).cs.costs.erase_count = sVar3;
  (ec->l).multi = lVar13;
  (ec->l).cs.costs._end = (wclass *)pcVar14;
  uVar5 = *(undefined4 *)((long)&(data->a_s)._begin + 4);
  uVar6 = *(undefined4 *)&(data->a_s)._end;
  uVar7 = *(undefined4 *)((long)&(data->a_s)._end + 4);
  uVar8 = *(undefined4 *)&(data->a_s).end_array;
  uVar9 = *(undefined4 *)((long)&(data->a_s).end_array + 4);
  sVar3 = (data->a_s).erase_count;
  uVar10 = *(undefined4 *)((long)&(data->a_s).erase_count + 4);
  (ec->pred).scalar = *(float *)&(data->a_s)._begin;
  *(undefined4 *)((long)&ec->pred + 4) = uVar5;
  *(undefined4 *)((long)&ec->pred + 8) = uVar6;
  *(undefined4 *)((long)&ec->pred + 0xc) = uVar7;
  *(undefined4 *)((long)&ec->pred + 0x10) = uVar8;
  *(undefined4 *)((long)&ec->pred + 0x14) = uVar9;
  *(int *)((long)&ec->pred + 0x18) = (int)sVar3;
  *(undefined4 *)((long)&ec->pred + 0x1c) = uVar10;
  (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  sVar3 = data->example_counter;
  data->example_counter = sVar3 + 1;
  local_1b0 = (ec->pred).scalars._begin;
  _local_210 = *(undefined8 *)((long)&ec->pred + 8);
  local_1b8 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_218 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  iVar17 = exploration::sample_after_normalizing<ACTION_SCORE::score_iterator>
                     (sVar3 + data->app_seed,&local_1b8,&local_218,&local_23c);
  if (iVar17 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(&local_1a8,"Failed to sample from pdf",0x19);
    pvVar19 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar19,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cbify.cc"
               ,0x9e,&local_1d8);
    __cxa_throw(pvVar19,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  local_228 = &ec->pred;
  uVar18 = local_23c + 1;
  local_218._4_4_ = uVar18;
  local_210 = (local_228->a_s)._begin[local_23c].score;
  if (uVar18 == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (&local_1a8,"No action with non-zero probability found!",0x2a);
    pvVar19 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar19,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cbify.cc"
               ,0xa5,&local_1f8);
    __cxa_throw(pvVar19,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  local_238 = &ec->l;
  local_230 = &(ec->l).cs.costs.end_array;
  if (pwVar1 == pwVar2) {
    fVar21 = 0.0;
  }
  else {
    fVar21 = 0.0;
    pwVar4 = pwVar1;
    do {
      pwVar20 = pwVar4 + 1;
      if (pwVar4->class_index == uVar18) {
        fVar21 = pwVar4->x;
        break;
      }
      pwVar4 = pwVar20;
    } while (pwVar20 != pwVar2);
  }
  local_218._0_4_ = (data->loss1 - data->loss0) * fVar21 + data->loss0;
  local_220 = pwVar1;
  v_array<CB::cb_class>::push_back((v_array<CB::cb_class> *)data,(cb_class *)&local_218);
  fVar21 = *(float *)&(data->cb_label).costs._begin;
  fVar11 = *(float *)((long)&(data->cb_label).costs._begin + 4);
  fVar12 = *(float *)&(data->cb_label).costs._end;
  uVar5 = *(undefined4 *)((long)&(data->cb_label).costs._end + 4);
  uVar6 = *(undefined4 *)((long)&(data->cb_label).costs.end_array + 4);
  sVar3 = (data->cb_label).costs.erase_count;
  uVar7 = *(undefined4 *)((long)&(data->cb_label).costs.erase_count + 4);
  *(undefined4 *)((long)local_238 + 0x10) = *(undefined4 *)&(data->cb_label).costs.end_array;
  *(undefined4 *)((long)local_238 + 0x14) = uVar6;
  *(int *)((long)local_238 + 0x18) = (int)sVar3;
  *(undefined4 *)((long)local_238 + 0x1c) = uVar7;
  (local_238->simple).label = fVar21;
  (local_238->simple).weight = fVar11;
  (local_238->simple).initial = fVar12;
  *(undefined4 *)((long)local_238 + 0xc) = uVar5;
  (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  v_array<ACTION_SCORE::action_score>::clear(&data->a_s);
  paVar15 = (action_score *)(local_228->scalars)._begin;
  paVar16 = (action_score *)(local_228->scalars)._end;
  sVar3 = (local_228->scalars).erase_count;
  (data->a_s).end_array = (action_score *)(local_228->scalars).end_array;
  (data->a_s).erase_count = sVar3;
  (data->a_s)._begin = paVar15;
  (data->a_s)._end = paVar16;
  (ec->l).cs.costs._begin = local_220;
  (ec->l).cs.costs._end = pwVar2;
  *local_230 = local_208;
  local_230[1] = (wclass *)sStack_200;
  (ec->pred).multiclass = local_218._4_4_;
  return;
}

Assistant:

void predict_or_learn(cbify& data, single_learner& base, example& ec)
{
  // Store the multiclass or cost-sensitive input label
  MULTICLASS::label_t ld;
  COST_SENSITIVE::label csl;
  if (use_cs)
    csl = ec.l.cs;
  else
    ld = ec.l.multi;

  data.cb_label.costs.clear();
  ec.l.cb = data.cb_label;
  ec.pred.a_s = data.a_s;

  // Call the cb_explore algorithm. It returns a vector of probabilities for each action
  base.predict(ec);
  // data.probs = ec.pred.scalars;

  uint32_t chosen_action;
  if (sample_after_normalizing(
          data.app_seed + data.example_counter++, begin_scores(ec.pred.a_s), end_scores(ec.pred.a_s), chosen_action))
    THROW("Failed to sample from pdf");

  CB::cb_class cl;
  cl.action = chosen_action + 1;
  cl.probability = ec.pred.a_s[chosen_action].score;

  if (!cl.action)
    THROW("No action with non-zero probability found!");
  if (use_cs)
    cl.cost = loss_cs(data, csl.costs, cl.action);
  else
    cl.cost = loss(data, ld.label, cl.action);

  // Create a new cb label
  data.cb_label.costs.push_back(cl);
  ec.l.cb = data.cb_label;

  if (is_learn)
    base.learn(ec);

  data.a_s.clear();
  data.a_s = ec.pred.a_s;

  if (use_cs)
    ec.l.cs = csl;
  else
    ec.l.multi = ld;

  ec.pred.multiclass = cl.action;
}